

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestGroupStats::~TestGroupStats(TestGroupStats *this)

{
  TestGroupStats *this_local;
  
  ~TestGroupStats(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

TestGroupStats::~TestGroupStats() {}